

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O1

void mpi_sub_hlp(mbedtls_mpi *X,mbedtls_mpi *A,mbedtls_mpi *B)

{
  mbedtls_mpi_uint *pmVar1;
  mbedtls_mpi_uint *pmVar2;
  mbedtls_mpi_uint *pmVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  bool bVar8;
  
  uVar6 = B->n;
  if (A->n < B->n) {
    uVar6 = A->n;
  }
  if (uVar6 == 0) {
    uVar5 = 0;
    uVar4 = 0;
  }
  else {
    pmVar1 = A->p;
    pmVar2 = B->p;
    pmVar3 = X->p;
    uVar4 = 0;
    uVar5 = 0;
    do {
      uVar7 = pmVar1[uVar4] - uVar5;
      uVar5 = (ulong)(uVar7 < pmVar2[uVar4]) + (ulong)(pmVar1[uVar4] < uVar5);
      pmVar3[uVar4] = uVar7 - pmVar2[uVar4];
      uVar4 = uVar4 + 1;
    } while (uVar6 != uVar4);
  }
  if ((uVar4 < A->n) && (uVar5 != 0)) {
    pmVar1 = A->p;
    pmVar2 = X->p;
    do {
      uVar6 = pmVar1[uVar4];
      bVar8 = uVar6 < uVar5;
      pmVar2[uVar4] = uVar6 - uVar5;
      uVar4 = uVar4 + 1;
      if (A->n <= uVar4) break;
      uVar5 = (ulong)bVar8;
    } while (bVar8);
  }
  if (uVar4 < A->n) {
    pmVar1 = A->p;
    pmVar2 = X->p;
    do {
      pmVar2[uVar4] = pmVar1[uVar4];
      uVar4 = uVar4 + 1;
    } while (uVar4 < A->n);
  }
  if (uVar4 < X->n) {
    pmVar1 = X->p;
    do {
      pmVar1[uVar4] = 0;
      uVar4 = uVar4 + 1;
    } while (uVar4 < X->n);
  }
  return;
}

Assistant:

static void mpi_sub_hlp( mbedtls_mpi *X, const mbedtls_mpi *A, const mbedtls_mpi *B )
{
    size_t i;
    mbedtls_mpi_uint c = 0;
    size_t width = A->n > B->n ? B->n : A->n;

    for( i = 0; i < width; i++ )
    {
        mbedtls_mpi_uint a = A->p[i];
        mbedtls_mpi_uint b = B->p[i];
        mbedtls_mpi_uint z = a < c;

        X->p[i] = a - c;
        c = ( X->p[i] <  b ) + z;
        X->p[i] -= b;
    }

    for( ; i < A->n && c > 0; i++ )
    {
        mbedtls_mpi_uint a = A->p[i];
        mbedtls_mpi_uint z = a < c;
        X->p[i] = a - c;
        c = z;
    }

    for( ; i < A->n; i++ )
    {
        X->p[i] = A->p[i];
    }

    for( ; i < X->n; i++ )
    {
        X->p[i] = 0;
    }
}